

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_vdpu383.c
# Opt level: O0

MPP_RET hal_vp9d_vdpu383_wait(void *hal,HalTaskInfo *task)

{
  uint uVar1;
  MppFrame local_50;
  MppFrame mframe;
  uint *puStack_40;
  RK_U32 i;
  RK_U32 *p;
  Vdpu383Vp9dRegSet *hw_regs;
  Vdpu383Vp9dCtx *hw_ctx;
  HalVp9dCtx *p_hal;
  HalTaskInfo *pHStack_18;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *hal_local;
  
  p_hal._4_4_ = 0;
  hw_regs = *(Vdpu383Vp9dRegSet **)((long)hal + 0x40);
  p = *(RK_U32 **)&(hw_regs->vp9d_paras).reg66_stream_len;
  if (*(int *)((long)hal + 0x38) != 0) {
    p = *(RK_U32 **)
         ((hw_regs->ctrl_regs).reserve_reg24_26 + (long)(task->dec).reg_index * 0x10 + -5);
  }
  hw_ctx = (Vdpu383Vp9dCtx *)hal;
  pHStack_18 = task;
  task_local = (HalTaskInfo *)hal;
  if ((p == (RK_U32 *)0x0) &&
     (_mpp_log_l(2,"hal_vp9d_vdpu383","Assertion %s failed at %s:%d\n",(char *)0x0,"hw_regs",
                 "hal_vp9d_vdpu383_wait",0x4c0), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  p_hal._4_4_ = mpp_dev_ioctl(hw_ctx->g_buf[0].probe_base,0x10,(void *)0x0);
  if (p_hal._4_4_ != MPP_OK) {
    _mpp_log_l(2,"hal_vp9d_vdpu383","poll cmd failed %d\n","hal_vp9d_vdpu383_wait",
               (ulong)(uint)p_hal._4_4_);
  }
  if ((hal_vp9d_debug & 4) != 0) {
    puStack_40 = p;
    for (mframe._4_4_ = 0; mframe._4_4_ < 0xa6; mframe._4_4_ = mframe._4_4_ + 1) {
      uVar1 = *puStack_40;
      puStack_40 = puStack_40 + 1;
      _mpp_log_l(4,"hal_vp9d_vdpu383","get regs[%02d]: %08X\n",(char *)0x0,(ulong)mframe._4_4_,
                 (ulong)uVar1);
    }
  }
  if ((((((((pHStack_18->dec).flags.val >> 2 & 1) != 0) ||
         (((pHStack_18->dec).flags.val >> 3 & 1) != 0)) || ((p[8] & 1) == 0)) ||
       (((p[8] >> 1 & 1) != 0 || ((p[8] >> 2 & 1) != 0)))) ||
      (((p[8] >> 3 & 1) != 0 || (((p[8] >> 4 & 1) != 0 || ((p[8] >> 5 & 1) != 0)))))) ||
     ((p[8] >> 6 & 1) != 0)) {
    local_50 = (MppFrame)0x0;
    mpp_buf_slot_get_prop
              (hw_ctx->g_buf[0].count_base,(pHStack_18->dec).output,SLOT_FRAME_PTR,&local_50);
    mpp_frame_set_errinfo(local_50,1);
  }
  if (*(int *)&hw_ctx->g_buf[0].rcb_buf != 0) {
    (hw_regs->ctrl_regs).reserve_reg24_26[(long)(pHStack_18->dec).reg_index * 0x10 + -0x11] = 0;
  }
  return p_hal._4_4_;
}

Assistant:

static MPP_RET hal_vp9d_vdpu383_wait(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    HalVp9dCtx *p_hal = (HalVp9dCtx*)hal;
    Vdpu383Vp9dCtx *hw_ctx = (Vdpu383Vp9dCtx*)p_hal->hw_ctx;
    Vdpu383Vp9dRegSet *hw_regs = (Vdpu383Vp9dRegSet *)hw_ctx->hw_regs;

    if (p_hal->fast_mode)
        hw_regs = (Vdpu383Vp9dRegSet *)hw_ctx->g_buf[task->dec.reg_index].hw_regs;

    mpp_assert(hw_regs);

    ret = mpp_dev_ioctl(p_hal->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret)
        mpp_err_f("poll cmd failed %d\n", ret);
#ifdef DUMP_VDPU383_DATAS
    {
        char *cur_fname = "cabac_update_probe.dat";
        DXVA_PicParams_VP9 *pic_param = (DXVA_PicParams_VP9*)task->dec.syntax.data;
        RK_U32 frame_ctx_id = pic_param->frame_context_idx;
        memset(dump_cur_fname_path, 0, sizeof(dump_cur_fname_path));
        sprintf(dump_cur_fname_path, "%s/%s", dump_cur_dir, cur_fname);
        dump_data_to_file(dump_cur_fname_path,
                          (void *)mpp_buffer_get_ptr(hw_ctx->prob_loop_base[frame_ctx_id]),
                          8 * 152 * 16, 128, 0);
    }
    {
        char *cur_fname = "segid_last.dat";
        memset(dump_cur_fname_path, 0, sizeof(dump_cur_fname_path));
        sprintf(dump_cur_fname_path, "%s/%s", dump_cur_dir, cur_fname);
        if (!cur_last_segid_flag)
            dump_data_to_file(dump_cur_fname_path,
                              (void *)mpp_buffer_get_ptr(hw_ctx->segid_cur_base),
                              8 * 1559 * 8, 64, 0);
        else
            dump_data_to_file(dump_cur_fname_path,
                              (void *)mpp_buffer_get_ptr(hw_ctx->segid_last_base),
                              8 * 1559 * 8, 64, 0);
    }
    {
        char *cur_fname = "segid_cur.dat";
        memset(dump_cur_fname_path, 0, sizeof(dump_cur_fname_path));
        sprintf(dump_cur_fname_path, "%s/%s", dump_cur_dir, cur_fname);
        if (cur_last_segid_flag)
            dump_data_to_file(dump_cur_fname_path,
                              (void *)mpp_buffer_get_ptr(hw_ctx->segid_cur_base),
                              8 * 1559 * 8, 64, 0);
        else
            dump_data_to_file(dump_cur_fname_path,
                              (void *)mpp_buffer_get_ptr(hw_ctx->segid_last_base),
                              8 * 1559 * 8, 64, 0);
    }
#endif

    if (hal_vp9d_debug & HAL_VP9D_DBG_REG) {
        RK_U32 *p = (RK_U32 *)hw_regs;
        RK_U32 i = 0;

        for (i = 0; i < sizeof(Vdpu383Vp9dRegSet) / 4; i++)
            mpp_log("get regs[%02d]: %08X\n", i, *p++);
    }

    if (task->dec.flags.parse_err ||
        task->dec.flags.ref_err ||
        (!hw_regs->ctrl_regs.reg15.rkvdec_frame_rdy_sta) ||
        hw_regs->ctrl_regs.reg15.rkvdec_strm_error_sta ||
        hw_regs->ctrl_regs.reg15.rkvdec_core_timeout_sta ||
        hw_regs->ctrl_regs.reg15.rkvdec_ip_timeout_sta ||
        hw_regs->ctrl_regs.reg15.rkvdec_bus_error_sta ||
        hw_regs->ctrl_regs.reg15.rkvdec_buffer_empty_sta ||
        hw_regs->ctrl_regs.reg15.rkvdec_colmv_ref_error_sta) {
        MppFrame mframe = NULL;

        mpp_buf_slot_get_prop(p_hal->slots, task->dec.output, SLOT_FRAME_PTR, &mframe);
        mpp_frame_set_errinfo(mframe, 1);
    }

#if !HW_PROB
    if (p_hal->dec_cb && task->dec.flags.wait_done) {
        DXVA_PicParams_VP9 *pic_param = (DXVA_PicParams_VP9*)task->dec.syntax.data;
        hal_vp9d_update_counts(mpp_buffer_get_ptr(hw_ctx->count_base), task->dec.syntax.data);
        mpp_callback(p_hal->dec_cb, &pic_param->counts);
    }
#endif
    if (p_hal->fast_mode) {
        hw_ctx->g_buf[task->dec.reg_index].use_flag = 0;
    }

    (void)task;
    return ret;
}